

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNodeChain<QByteArray>::free(MultiNodeChain<QByteArray> *this,void *__ptr)

{
  MultiNodeChain<QByteArray> *pMVar1;
  
  while (this != (MultiNodeChain<QByteArray> *)0x0) {
    pMVar1 = this->next;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
    operator_delete(this,0x20);
    this = pMVar1;
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }